

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float16 float32_to_float16_arm(float32 a,_Bool ieee,float_status *s)

{
  undefined7 in_register_00000031;
  FloatFmt *dstf;
  FloatParts FVar1;
  
  dstf = &float16_params_ahp;
  if ((int)CONCAT71(in_register_00000031,ieee) != 0) {
    dstf = &float16_params;
  }
  FVar1._8_8_ = (ulong)(a >> 0x17) & 0xff | (ulong)(a & 0x80000000) << 9;
  FVar1.frac = (ulong)(a & 0x7fffff);
  FVar1 = sf_canonicalize(FVar1,&float32_params,s);
  FVar1 = float_to_float(FVar1,dstf,s);
  FVar1 = round_canonical(FVar1,s,dstf);
  return (ushort)FVar1.frac & 0x3ff | (ushort)((FVar1.exp & 0x1fU) << 10) |
         (ushort)(FVar1._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 float32_to_float16(float32 a, bool ieee, float_status *s)
{
    const FloatFmt *fmt16 = ieee ? &float16_params : &float16_params_ahp;
    FloatParts p = float32_unpack_canonical(a, s);
    FloatParts pr = float_to_float(p, fmt16, s);
    return float16a_round_pack_canonical(pr, s, fmt16);
}